

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

__m128i filter_block(__m128i a,__m128i b,__m128i filter)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int in_EDX;
  longlong in_RSI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  __m128i alVar5;
  __m128i v_val_w;
  __m128i v_val_w_00;
  __m128i v1;
  __m128i v0;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_30;
  undefined1 uStack_2f;
  undefined1 uStack_2e;
  undefined1 uStack_2d;
  undefined1 uStack_2c;
  undefined1 uStack_2b;
  undefined1 uStack_2a;
  undefined1 uStack_29;
  
  local_98 = (undefined1)in_XMM0_Qa;
  uStack_97 = (undefined1)((ulong)in_XMM0_Qa >> 8);
  uStack_96 = (undefined1)((ulong)in_XMM0_Qa >> 0x10);
  uStack_95 = (undefined1)((ulong)in_XMM0_Qa >> 0x18);
  uStack_94 = (undefined1)((ulong)in_XMM0_Qa >> 0x20);
  uStack_93 = (undefined1)((ulong)in_XMM0_Qa >> 0x28);
  uStack_92 = (undefined1)((ulong)in_XMM0_Qa >> 0x30);
  uStack_91 = (undefined1)((ulong)in_XMM0_Qa >> 0x38);
  local_a8 = (undefined1)in_XMM1_Qa;
  uStack_a7 = (undefined1)((ulong)in_XMM1_Qa >> 8);
  uStack_a6 = (undefined1)((ulong)in_XMM1_Qa >> 0x10);
  uStack_a5 = (undefined1)((ulong)in_XMM1_Qa >> 0x18);
  uStack_a4 = (undefined1)((ulong)in_XMM1_Qa >> 0x20);
  uStack_a3 = (undefined1)((ulong)in_XMM1_Qa >> 0x28);
  uStack_a2 = (undefined1)((ulong)in_XMM1_Qa >> 0x30);
  uStack_a1 = (undefined1)((ulong)in_XMM1_Qa >> 0x38);
  local_e8._0_2_ = CONCAT11(local_a8,local_98);
  local_e8._0_3_ = CONCAT12(uStack_97,(undefined2)local_e8);
  local_e8._0_4_ = CONCAT13(uStack_a7,(undefined3)local_e8);
  local_e8._0_5_ = CONCAT14(uStack_96,(undefined4)local_e8);
  local_e8._0_6_ = CONCAT15(uStack_a6,(undefined5)local_e8);
  local_e8._0_7_ = CONCAT16(uStack_95,(undefined6)local_e8);
  local_e8 = CONCAT17(uStack_a5,(undefined7)local_e8);
  uStack_e0._0_1_ = uStack_94;
  uStack_e0._1_1_ = uStack_a4;
  uStack_e0._2_1_ = uStack_93;
  uStack_e0._3_1_ = uStack_a3;
  uStack_e0._4_1_ = uStack_92;
  uStack_e0._5_1_ = uStack_a2;
  uStack_e0._6_1_ = uStack_91;
  uStack_e0._7_1_ = uStack_a1;
  auVar4._8_8_ = uStack_e0;
  auVar4._0_8_ = local_e8;
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  pmaddubsw(auVar4,auVar3);
  v_val_w[1] = in_RSI;
  v_val_w[0] = 7;
  alVar5 = xx_roundn_epu16(v_val_w,in_EDX);
  uStack_30 = (undefined1)in_XMM0_Qb;
  uStack_2f = (undefined1)((ulong)in_XMM0_Qb >> 8);
  uStack_2e = (undefined1)((ulong)in_XMM0_Qb >> 0x10);
  uStack_2d = (undefined1)((ulong)in_XMM0_Qb >> 0x18);
  uStack_2c = (undefined1)((ulong)in_XMM0_Qb >> 0x20);
  uStack_2b = (undefined1)((ulong)in_XMM0_Qb >> 0x28);
  uStack_2a = (undefined1)((ulong)in_XMM0_Qb >> 0x30);
  uStack_29 = (undefined1)((ulong)in_XMM0_Qb >> 0x38);
  uStack_40 = (undefined1)in_XMM1_Qb;
  uStack_3f = (undefined1)((ulong)in_XMM1_Qb >> 8);
  uStack_3e = (undefined1)((ulong)in_XMM1_Qb >> 0x10);
  uStack_3d = (undefined1)((ulong)in_XMM1_Qb >> 0x18);
  uStack_3c = (undefined1)((ulong)in_XMM1_Qb >> 0x20);
  uStack_3b = (undefined1)((ulong)in_XMM1_Qb >> 0x28);
  uStack_3a = (undefined1)((ulong)in_XMM1_Qb >> 0x30);
  uStack_39 = (undefined1)((ulong)in_XMM1_Qb >> 0x38);
  local_f8._0_2_ = CONCAT11(uStack_40,uStack_30);
  local_f8._0_3_ = CONCAT12(uStack_2f,(undefined2)local_f8);
  local_f8._0_4_ = CONCAT13(uStack_3f,(undefined3)local_f8);
  local_f8._0_5_ = CONCAT14(uStack_2e,(undefined4)local_f8);
  local_f8._0_6_ = CONCAT15(uStack_3e,(undefined5)local_f8);
  local_f8._0_7_ = CONCAT16(uStack_2d,(undefined6)local_f8);
  local_f8 = CONCAT17(uStack_3d,(undefined7)local_f8);
  uStack_f0._0_1_ = uStack_2c;
  uStack_f0._1_1_ = uStack_3c;
  uStack_f0._2_1_ = uStack_2b;
  uStack_f0._3_1_ = uStack_3b;
  uStack_f0._4_1_ = uStack_2a;
  uStack_f0._5_1_ = uStack_3a;
  uStack_f0._6_1_ = uStack_29;
  uStack_f0._7_1_ = uStack_39;
  auVar2._8_8_ = uStack_f0;
  auVar2._0_8_ = local_f8;
  auVar1._8_8_ = in_XMM2_Qb;
  auVar1._0_8_ = in_XMM2_Qa;
  pmaddubsw(auVar2,auVar1);
  v_val_w_00[1] = in_RSI;
  v_val_w_00[0] = 7;
  alVar5 = xx_roundn_epu16(v_val_w_00,(int)alVar5[1]);
  alVar5[0] = alVar5[0];
  alVar5[1] = alVar5[1];
  return alVar5;
}

Assistant:

static inline __m128i filter_block(const __m128i a, const __m128i b,
                                   const __m128i filter) {
  __m128i v0 = _mm_unpacklo_epi8(a, b);
  v0 = _mm_maddubs_epi16(v0, filter);
  v0 = xx_roundn_epu16(v0, FILTER_BITS);

  __m128i v1 = _mm_unpackhi_epi8(a, b);
  v1 = _mm_maddubs_epi16(v1, filter);
  v1 = xx_roundn_epu16(v1, FILTER_BITS);

  return _mm_packus_epi16(v0, v1);
}